

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_file_header_1(archive_read *a,lha *lha)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  int64_t iVar6;
  uchar sum_calculated;
  uchar headersum;
  wchar_t padding;
  wchar_t namelen;
  wchar_t err2;
  wchar_t err;
  wchar_t i;
  size_t extdsize;
  uchar *p;
  lha *lha_local;
  archive_read *a_local;
  
  namelen = L'\0';
  p = (uchar *)lha;
  lha_local = (lha *)a;
  extdsize = (size_t)__archive_read_ahead(a,0x1b,(ssize_t *)0x0);
  if ((byte *)extdsize == (byte *)0x0) {
    wVar4 = truncated_error((archive_read *)lha_local);
    return wVar4;
  }
  *(long *)(p + 0x20) = (long)(int)(*(byte *)extdsize + 2);
  bVar1 = *(byte *)(extdsize + 1);
  uVar5 = archive_le32dec((byte *)(extdsize + 7));
  *(ulong *)(p + 0x30) = (ulong)uVar5;
  uVar5 = archive_le32dec((void *)(extdsize + 0xb));
  *(ulong *)(p + 0x38) = (ulong)uVar5;
  uVar5 = archive_le32dec((void *)(extdsize + 0xf));
  iVar6 = dos_to_unix(uVar5);
  *(int64_t *)(p + 0x58) = iVar6;
  wVar4 = (wchar_t)*(byte *)(extdsize + 0x15);
  if (((uint)wVar4 < 0xe7) && (-1 < ((int)*(undefined8 *)(p + 0x20) + -0x1b) - wVar4)) {
    extdsize = (size_t)__archive_read_ahead
                                 ((archive_read *)lha_local,*(size_t *)(p + 0x20),(ssize_t *)0x0);
    if ((void *)extdsize == (void *)0x0) {
      wVar4 = truncated_error((archive_read *)lha_local);
      return wVar4;
    }
    for (err2 = L'\0'; err2 < wVar4; err2 = err2 + L'\x01') {
      if (*(char *)(extdsize + (long)(err2 + L'\x16')) == -1) goto LAB_00158d2b;
    }
    p[0xf8] = '\0';
    p[0xf9] = '\0';
    p[0xfa] = '\0';
    p[0xfb] = '\0';
    p[0xfc] = '\0';
    p[0xfd] = '\0';
    p[0xfe] = '\0';
    p[0xff] = '\0';
    archive_strncat((archive_string *)(p + 0xf0),(void *)(extdsize + 0x16),(long)wVar4);
    uVar3 = archive_le16dec((void *)(extdsize + 0x16 + (long)wVar4));
    *(uint16_t *)(p + 0xba) = uVar3;
    *(uint *)(p + 0x40) = *(uint *)(p + 0x40) | 8;
    bVar2 = lha_calcsum('\0',(void *)extdsize,L'\x02',*(long *)(p + 0x20) - 2);
    __archive_read_consume((archive_read *)lha_local,*(long *)(p + 0x20) + -2);
    wVar4 = lha_read_file_extended_header
                      ((archive_read *)lha_local,(lha *)p,(uint16_t *)0x0,L'\x02',
                       *(long *)(p + 0x30) + 2,(size_t *)&err);
    if (wVar4 < L'\xffffffec') {
      return wVar4;
    }
    if (wVar4 < L'\0') {
      namelen = wVar4;
    }
    *(long *)(p + 0x30) = *(long *)(p + 0x30) - (_err + -2);
    if (-1 < *(long *)(p + 0x30)) {
      if (bVar2 != bVar1) {
        archive_set_error((archive *)lha_local,-1,"LHa header sum error");
        return L'\xffffffe2';
      }
      return namelen;
    }
  }
LAB_00158d2b:
  archive_set_error((archive *)lha_local,0x54,"Invalid LHa header");
  return L'\xffffffe2';
}

Assistant:

static int
lha_read_file_header_1(struct archive_read *a, struct lha *lha)
{
	const unsigned char *p;
	size_t extdsize;
	int i, err, err2;
	int namelen, padding;
	unsigned char headersum, sum_calculated;

	err = ARCHIVE_OK;

	if ((p = __archive_read_ahead(a, H1_FIXED_SIZE, NULL)) == NULL)
		return (truncated_error(a));

	lha->header_size = p[H1_HEADER_SIZE_OFFSET] + 2;
	headersum = p[H1_HEADER_SUM_OFFSET];
	/* Note: An extended header size is included in a compsize. */
	lha->compsize = archive_le32dec(p + H1_COMP_SIZE_OFFSET);
	lha->origsize = archive_le32dec(p + H1_ORIG_SIZE_OFFSET);
	lha->mtime = dos_to_unix(archive_le32dec(p + H1_DOS_TIME_OFFSET));
	namelen = p[H1_NAME_LEN_OFFSET];
	/* Calculate a padding size. The result will be normally 0 only(?) */
	padding = ((int)lha->header_size) - H1_FIXED_SIZE - namelen;

	if (namelen > 230 || padding < 0)
		goto invalid;

	if ((p = __archive_read_ahead(a, lha->header_size, NULL)) == NULL)
		return (truncated_error(a));

	for (i = 0; i < namelen; i++) {
		if (p[i + H1_FILE_NAME_OFFSET] == 0xff)
			goto invalid;/* Invalid filename. */
	}
	archive_strncpy(&lha->filename, p + H1_FILE_NAME_OFFSET, namelen);
	lha->crc = archive_le16dec(p + H1_FILE_NAME_OFFSET + namelen);
	lha->setflag |= CRC_IS_SET;

	sum_calculated = lha_calcsum(0, p, 2, lha->header_size - 2);
	/* Consume used bytes but not include `next header size' data
	 * since it will be consumed in lha_read_file_extended_header(). */
	__archive_read_consume(a, lha->header_size - 2);

	/* Read extended headers */
	err2 = lha_read_file_extended_header(a, lha, NULL, 2,
	    (uint64_t)(lha->compsize + 2), &extdsize);
	if (err2 < ARCHIVE_WARN)
		return (err2);
	if (err2 < err)
		err = err2;
	/* Get a real compressed file size. */
	lha->compsize -= extdsize - 2;

	if (lha->compsize < 0)
		goto invalid;	/* Invalid compressed file size */

	if (sum_calculated != headersum) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "LHa header sum error");
		return (ARCHIVE_FATAL);
	}
	return (err);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid LHa header");
	return (ARCHIVE_FATAL);
}